

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeView::drawBranches(QTreeView *this,QPainter *painter,QRect *rect,QModelIndex *index)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ScrollMode SVar9;
  SelectionBehavior SVar10;
  int iVar11;
  int iVar12;
  QTreeViewPrivate *pQVar13;
  const_reference pQVar14;
  QItemSelectionModel *pQVar15;
  ulong uVar16;
  QStyle *pQVar17;
  qsizetype qVar18;
  const_reference pQVar19;
  QModelIndex *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTreeViewItem *successorItem;
  int successor;
  bool moreSiblings_1;
  bool moreSiblings;
  bool children;
  bool expanded;
  bool hoverRow;
  int level;
  QTreeViewItem *viewItem;
  int item;
  int outer;
  int indent;
  bool reverse;
  QTreeViewPrivate *d;
  QPoint oldBO;
  State extraFlags;
  QModelIndex ancestor;
  QModelIndex current;
  QModelIndex parent;
  QRect primitive;
  QStyleOptionViewItem opt;
  int in_stack_fffffffffffffd98;
  QFlagsStorage<QStyle::StateFlag> in_stack_fffffffffffffd9c;
  QStyleOptionViewItem *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  QModelIndex *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  ViewItemFeature in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int local_1f8;
  uint local_1ec;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  QAbstractItemModel *local_198;
  QFlagsStorage<QStyle::StateFlag> local_134;
  undefined1 *local_130;
  undefined1 *local_128;
  QAbstractItemModel *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  QAbstractItemModel *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  byte local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = d_func((QTreeView *)0x8f84fe);
  bVar4 = QWidget::isRightToLeft((QWidget *)0x8f8510);
  iVar1 = pQVar13->indent;
  uVar8 = (uint)((pQVar13->rootDecoration & 1U) == 0);
  iVar2 = pQVar13->current;
  pQVar14 = QList<QTreeViewItem>::at
                      ((QList<QTreeViewItem> *)in_stack_fffffffffffffda0,
                       CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
  local_1ec = (uint)((ulong)*(undefined8 *)&pQVar14->field_0x1c >> 0x20) & 0xffff;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  if (bVar4) {
    QRect::left((QRect *)0x8f85ea);
  }
  else {
    QRect::right((QRect *)0x8f85fd);
  }
  QRect::top((QRect *)0x8f8619);
  QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
  QRect::QRect((QRect *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),(int)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98);
  local_100 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent(in_stack_fffffffffffffdb0);
  local_118 = local_100;
  local_110 = local_f8;
  local_108.ptr = local_f0;
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_120 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent(in_stack_fffffffffffffdb0);
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8f8756);
  (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
  local_134.i = 0xaaaaaaaa;
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c.i);
  bVar5 = QWidget::isEnabled((QWidget *)0x8f8792);
  if (bVar5) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_134,State_Enabled);
  }
  bVar5 = QWidget::hasFocus((QWidget *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                           );
  if (bVar5) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_134,State_Active);
  }
  QPainter::brushOrigin();
  SVar9 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)in_stack_fffffffffffffda0);
  if (SVar9 == ScrollPerPixel) {
    (**(code **)(*in_RDI + 0x2b8))();
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c.i,
                   in_stack_fffffffffffffd98);
    QPainter::setBrushOrigin
              ((QPainter *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (QPoint *)in_stack_fffffffffffffda0);
  }
  if (((pQVar13->super_QAbstractItemViewPrivate).alternatingColors & 1U) != 0) {
    QFlags<QStyleOptionViewItem::ViewItemFeature>::setFlag
              ((QFlags<QStyleOptionViewItem::ViewItemFeature> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbc,SUB41((uint)in_stack_fffffffffffffdb8 >> 0x18,0));
  }
  SVar10 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_fffffffffffffda0);
  bVar5 = false;
  if ((SVar10 == SelectRows) && (bVar5 = false, (local_70 & 1) != 0)) {
    QModelIndex::parent(in_stack_fffffffffffffdb0);
    QPersistentModelIndex::parent();
    bVar6 = ::operator==((QModelIndex *)in_stack_fffffffffffffda0,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
    bVar5 = false;
    if (bVar6) {
      iVar11 = QModelIndex::row(in_RCX);
      iVar12 = QPersistentModelIndex::row();
      bVar5 = iVar11 == iVar12;
    }
  }
  pQVar15 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8f8957);
  uVar16 = QItemSelectionModel::isSelected((QModelIndex *)pQVar15);
  if ((uVar16 & 1) != 0) {
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&local_134,State_Selected);
  }
  if (uVar8 <= local_1ec) {
    if (bVar4) {
      QRect::left((QRect *)0x8f89a7);
    }
    else {
      QRect::left((QRect *)0x8f89ba);
    }
    QRect::moveLeft((QRect *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c.i);
    local_d0._8_8_ = local_e8;
    local_c0 = local_e0;
    ::operator|(State_None,(QFlags<QStyle::StateFlag>)in_stack_fffffffffffffd9c.i);
    QFlags<QStyle::StateFlag>::operator|
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c.i);
    QFlags<QStyle::StateFlag>::operator|
              ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c.i);
    local_d0._0_4_ =
         QFlags<QStyle::StateFlag>::operator|
                   ((QFlags<QStyle::StateFlag> *)in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffd9c.i);
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbc,SUB41((uint)in_stack_fffffffffffffdb8 >> 0x18,0));
    pQVar17 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
    (**(code **)(*(long *)pQVar17 + 0xb0))(pQVar17,0x17,local_d8,in_RSI,in_RDI);
  }
  do {
    local_1ec = local_1ec - 1;
    if ((int)local_1ec < (int)uVar8) {
      QPainter::setBrushOrigin
                ((QPainter *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (QPoint *)in_stack_fffffffffffffda0);
      QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffda0);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    if (bVar4) {
      iVar11 = QRect::left((QRect *)0x8f8bab);
      iVar11 = iVar11 + iVar1;
    }
    else {
      iVar11 = QRect::left((QRect *)0x8f8bc5);
      iVar11 = iVar11 - iVar1;
    }
    QRect::moveLeft((QRect *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c.i);
    local_d0._8_8_ = local_e8;
    local_c0 = local_e0;
    local_d0._0_4_ = local_134.i;
    bVar6 = false;
    bVar7 = QSet<QPersistentModelIndex>::isEmpty((QSet<QPersistentModelIndex> *)0x8f8c28);
    if (bVar7) {
      pQVar3 = (pQVar13->super_QAbstractItemViewPrivate).model;
      in_stack_fffffffffffffdc0 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_130);
      in_stack_fffffffffffffdc0 = in_stack_fffffffffffffdc0 + -1;
      iVar12 = QModelIndex::row((QModelIndex *)&local_118);
      bVar6 = iVar12 < in_stack_fffffffffffffdc0;
    }
    else {
      local_1f8 = iVar2 + ((uint)(*(ulong *)&pQVar14->field_0x1c >> 4) & 0xfffffff) + 1;
      while( true ) {
        in_stack_fffffffffffffdb0 = (QModelIndex *)(long)local_1f8;
        qVar18 = QList<QTreeViewItem>::size(&pQVar13->viewItems);
        in_stack_fffffffffffffdbc = in_stack_fffffffffffffdbc & 0xffffff;
        if ((long)in_stack_fffffffffffffdb0 < qVar18) {
          pQVar19 = QList<QTreeViewItem>::at
                              ((QList<QTreeViewItem> *)in_stack_fffffffffffffda0,
                               CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
          in_stack_fffffffffffffdbc =
               CONCAT13(local_1ec <=
                        ((uint)((ulong)*(undefined8 *)&pQVar19->field_0x1c >> 0x20) & 0xffff),
                        (int3)in_stack_fffffffffffffdbc);
        }
        if ((char)(in_stack_fffffffffffffdbc >> 0x18) == '\0') goto LAB_008f8d7b;
        pQVar19 = QList<QTreeViewItem>::at
                            ((QList<QTreeViewItem> *)in_stack_fffffffffffffda0,
                             CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
        if (((uint)((ulong)*(undefined8 *)&pQVar19->field_0x1c >> 0x20) & 0xffff) == local_1ec)
        break;
        local_1f8 = ((uint)(*(ulong *)&pQVar19->field_0x1c >> 4) & 0xfffffff) + 1 + local_1f8;
      }
      bVar6 = true;
    }
LAB_008f8d7b:
    if (bVar6) {
      QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)local_d0,State_Sibling);
    }
    in_stack_fffffffffffffda0 = (QStyleOptionViewItem *)local_d0;
    in_stack_fffffffffffffdaf = true;
    if (!bVar5) {
      in_stack_fffffffffffffdaf = iVar2 == pQVar13->hoverBranch;
    }
    QFlags<QStyle::StateFlag>::setFlag
              ((QFlags<QStyle::StateFlag> *)CONCAT44(iVar11,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbc,SUB41((uint)in_stack_fffffffffffffdb8 >> 0x18,0));
    pQVar17 = QWidget::style((QWidget *)
                             CONCAT44(in_stack_fffffffffffffd9c.i,in_stack_fffffffffffffd98));
    (**(code **)(*(long *)pQVar17 + 0xb0))(pQVar17,0x17,local_d8,in_RSI,in_RDI);
    local_118 = local_130;
    local_110 = local_128;
    local_108.ptr = local_120;
    QModelIndex::parent(in_stack_fffffffffffffdb0);
    local_130 = local_1a8;
    local_128 = local_1a0;
    local_120 = local_198;
  } while( true );
}

Assistant:

void QTreeView::drawBranches(QPainter *painter, const QRect &rect,
                             const QModelIndex &index) const
{
    Q_D(const QTreeView);
    const bool reverse = isRightToLeft();
    const int indent = d->indent;
    const int outer = d->rootDecoration ? 0 : 1;
    const int item = d->current;
    const QTreeViewItem &viewItem = d->viewItems.at(item);
    int level = viewItem.level;
    QRect primitive(reverse ? rect.left() : rect.right() + 1, rect.top(), indent, rect.height());

    QModelIndex parent = index.parent();
    QModelIndex current = parent;
    QModelIndex ancestor = current.parent();

    QStyleOptionViewItem opt;
    initViewItemOption(&opt);
    QStyle::State extraFlags = QStyle::State_None;
    if (isEnabled())
        extraFlags |= QStyle::State_Enabled;
    if (hasFocus())
        extraFlags |= QStyle::State_Active;
    QPoint oldBO = painter->brushOrigin();
    if (verticalScrollMode() == QAbstractItemView::ScrollPerPixel)
        painter->setBrushOrigin(QPoint(0, verticalOffset()));

    if (d->alternatingColors) {
        opt.features.setFlag(QStyleOptionViewItem::Alternate, d->current & 1);
    }

    // When hovering over a row, pass State_Hover for painting the branch
    // indicators if it has the decoration (aka branch) selected.
    bool hoverRow = selectionBehavior() == QAbstractItemView::SelectRows
                    && opt.showDecorationSelected
                    && index.parent() == d->hover.parent()
                    && index.row() == d->hover.row();

    if (d->selectionModel->isSelected(index))
        extraFlags |= QStyle::State_Selected;

    if (level >= outer) {
        // start with the innermost branch
        primitive.moveLeft(reverse ? primitive.left() : primitive.left() - indent);
        opt.rect = primitive;

        const bool expanded = viewItem.expanded;
        const bool children = viewItem.hasChildren;
        bool moreSiblings = viewItem.hasMoreSiblings;

        opt.state = QStyle::State_Item | extraFlags
                    | (moreSiblings ? QStyle::State_Sibling : QStyle::State_None)
                    | (children ? QStyle::State_Children : QStyle::State_None)
                    | (expanded ? QStyle::State_Open : QStyle::State_None);
        opt.state.setFlag(QStyle::State_MouseOver, hoverRow || item == d->hoverBranch);

        style()->drawPrimitive(QStyle::PE_IndicatorBranch, &opt, painter, this);
    }
    // then go out level by level
    for (--level; level >= outer; --level) { // we have already drawn the innermost branch
        primitive.moveLeft(reverse ? primitive.left() + indent : primitive.left() - indent);
        opt.rect = primitive;
        opt.state = extraFlags;
        bool moreSiblings = false;
        if (d->hiddenIndexes.isEmpty()) {
            moreSiblings = (d->model->rowCount(ancestor) - 1 > current.row());
        } else {
            int successor = item + viewItem.total + 1;
            while (successor < d->viewItems.size()
                   && d->viewItems.at(successor).level >= uint(level)) {
                const QTreeViewItem &successorItem = d->viewItems.at(successor);
                if (successorItem.level == uint(level)) {
                    moreSiblings = true;
                    break;
                }
                successor += successorItem.total + 1;
            }
        }
        if (moreSiblings)
            opt.state |= QStyle::State_Sibling;
        opt.state.setFlag(QStyle::State_MouseOver, hoverRow || item == d->hoverBranch);

        style()->drawPrimitive(QStyle::PE_IndicatorBranch, &opt, painter, this);
        current = ancestor;
        ancestor = current.parent();
    }
    painter->setBrushOrigin(oldBO);
}